

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::RandomShaderCase::checkProgramLimits
          (RandomShaderCase *this,Shader *vtxShader,Shader *frgShader)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  undefined1 auVar3 [16];
  int numSupported;
  int numRequiredCombinedSamplers;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  iVar1 = getNumSamplerUniforms(&vtxShader->m_uniforms);
  iVar2 = getNumSamplerUniforms(&frgShader->m_uniforms);
  iVar2 = iVar2 + iVar1;
  if (0 < iVar2) {
    numSupported = -1;
    numRequiredCombinedSamplers = iVar2;
    iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8b4d,&numSupported);
    iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    local_80._M_string_length._0_4_ = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
    if ((int)local_80._M_string_length != 0) {
      auVar3 = __cxa_allocate_exception(0x38);
      local_80._M_dataplus._M_p = (pointer)glu::getErrorName;
      de::toString<tcu::Format::Enum<int,2ul>>(&local_c0,(de *)&local_80,auVar3._8_8_);
      std::operator+(&local_a0,"Limit query failed: ",&local_c0);
      tcu::TestError::TestError(auVar3._0_8_,&local_a0);
      __cxa_throw(auVar3._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (numSupported < iVar2) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>(&local_40,&numRequiredCombinedSamplers);
      std::operator+(&local_80,"Program requires ",&local_40);
      std::operator+(&local_c0,&local_80," sampler(s). Implementation supports ");
      de::toString<int>(&local_60,&numSupported);
      std::operator+(&local_a0,&local_c0,&local_60);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_a0);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void RandomShaderCase::checkProgramLimits (const rsg::Shader& vtxShader, const rsg::Shader& frgShader) const
{
	const int numRequiredCombinedSamplers = getNumSamplerUniforms(vtxShader.getUniforms()) + getNumSamplerUniforms(frgShader.getUniforms());

	if (numRequiredCombinedSamplers > 0)
	{
		int				numSupported	= -1;
		GLenum			error;

		m_renderCtx.getFunctions().getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &numSupported);
		error = m_renderCtx.getFunctions().getError();

		if (error != GL_NO_ERROR)
			throw tcu::TestError("Limit query failed: " + de::toString(glu::getErrorStr(error)));

		if (numSupported < numRequiredCombinedSamplers)
			throw tcu::NotSupportedError("Program requires " + de::toString(numRequiredCombinedSamplers) + " sampler(s). Implementation supports " + de::toString(numSupported));
	}
}